

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_zhao_2010.h
# Opt level: O2

void __thiscall SBLA::FindRootAndCompressMem(SBLA *this,MemMat<int> *img_labels,int pos,int newroot)

{
  int iVar1;
  int *piVar2;
  bool bVar3;
  
  do {
    piVar2 = MemMat<int>::operator()(img_labels,-pos);
    iVar1 = *piVar2;
    if (iVar1 == newroot) {
      return;
    }
    piVar2 = MemMat<int>::operator()(img_labels,-pos);
    *piVar2 = newroot;
    bVar3 = iVar1 != pos;
    pos = iVar1;
  } while (bVar3);
  return;
}

Assistant:

inline void FindRootAndCompressMem(MemMat<int>& img_labels, int pos, int newroot)
    {
        while (true) {
            int tmppos = img_labels(-pos);
            if (tmppos == newroot)
                break;
            img_labels(-pos) = newroot;
            if (tmppos == pos)
                break;
            pos = tmppos;
        }
    }